

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O1

void __thiscall
capnp::compiler::NodeTranslator::compileBootstrapValue
          (NodeTranslator *this,Reader source,Reader type,Builder target,Schema typeScope)

{
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> **ppRVar1;
  UnfinishedValue *pUVar2;
  UnfinishedValue *pUVar3;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar4;
  ushort uVar5;
  long lVar6;
  size_t newSize;
  SegmentReader **ppSVar7;
  RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *pRVar8;
  byte bVar9;
  SegmentReader *local_88;
  CapTableReader *pCStack_80;
  void *local_78;
  WirePointer *pWStack_70;
  StructDataBitCount local_68;
  StructPointerCount SStack_64;
  undefined2 uStack_62;
  int iStack_60;
  undefined4 uStack_5c;
  SegmentReader *local_58;
  CapTableReader *pCStack_50;
  void *local_48;
  WirePointer *pWStack_40;
  undefined8 local_38;
  int iStack_30;
  undefined4 uStack_2c;
  
  bVar9 = 0;
  compileDefaultDefaultValue(this,type,target);
  if (type._reader.dataSize < 0x10) {
    uVar5 = 0;
  }
  else {
    uVar5 = *type._reader.data;
  }
  if ((uVar5 < 0x13) && ((0x74000U >> (uVar5 & 0x1f) & 1) != 0)) {
    local_68 = source._reader.dataSize;
    SStack_64 = source._reader.pointerCount;
    uStack_62 = source._reader._38_2_;
    iStack_60 = source._reader.nestingLimit;
    uStack_5c = source._reader._44_4_;
    local_78 = source._reader.data;
    pWStack_70 = source._reader.pointers;
    local_88 = source._reader.segment;
    pCStack_80 = source._reader.capTable;
    local_38 = type._reader._32_8_;
    iStack_30 = type._reader.nestingLimit;
    uStack_2c = type._reader._44_4_;
    local_48 = type._reader.data;
    pWStack_40 = type._reader.pointers;
    local_58 = type._reader.segment;
    pCStack_50 = type._reader.capTable;
    pUVar2 = (this->unfinishedValues).builder.endPtr;
    if ((this->unfinishedValues).builder.pos == pUVar2) {
      pUVar3 = (this->unfinishedValues).builder.ptr;
      newSize = 4;
      if (pUVar2 != pUVar3) {
        newSize = ((long)pUVar2 - (long)pUVar3 >> 4) * 0x1c71c71c71c71c72;
      }
      kj::Vector<capnp::compiler::NodeTranslator::UnfinishedValue>::setCapacity
                (&this->unfinishedValues,newSize);
    }
    pRVar4 = (this->unfinishedValues).builder.pos;
    ppSVar7 = &local_88;
    pRVar8 = pRVar4;
    for (lVar6 = 0xc; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pRVar8->source)._reader.segment = *ppSVar7;
      ppSVar7 = ppSVar7 + (ulong)bVar9 * -2 + 1;
      pRVar8 = (RemoveConst<capnp::compiler::NodeTranslator::UnfinishedValue> *)
               ((long)pRVar8 + (ulong)bVar9 * -0x10 + 8);
    }
    (pRVar4->typeScope).raw = typeScope.raw;
    (pRVar4->target)._builder.segment = target._builder.segment;
    (pRVar4->target)._builder.capTable = target._builder.capTable;
    (pRVar4->target)._builder.data = target._builder.data;
    (pRVar4->target)._builder.pointers = target._builder.pointers;
    (pRVar4->target)._builder.dataSize = target._builder.dataSize;
    (pRVar4->target)._builder.pointerCount = target._builder.pointerCount;
    *(undefined2 *)&(pRVar4->target)._builder.field_0x26 = target._builder._38_2_;
    ppRVar1 = &(this->unfinishedValues).builder.pos;
    *ppRVar1 = *ppRVar1 + 1;
    return;
  }
  compileValue(this,source,type,typeScope,target,true);
  return;
}

Assistant:

void NodeTranslator::compileBootstrapValue(
    Expression::Reader source, schema::Type::Reader type, schema::Value::Builder target,
    Schema typeScope) {
  // Start by filling in a default default value so that if for whatever reason we don't end up
  // initializing the value, this won't cause schema validation to fail.
  compileDefaultDefaultValue(type, target);

  switch (type.which()) {
    case schema::Type::LIST:
    case schema::Type::STRUCT:
    case schema::Type::INTERFACE:
    case schema::Type::ANY_POINTER:
      unfinishedValues.add(UnfinishedValue { source, type, typeScope, target });
      break;

    default:
      // Primitive value.
      compileValue(source, type, typeScope, target, true);
      break;
  }
}